

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STExchange.h
# Opt level: O2

optional<unsigned_int>
jbcoin::get<unsigned_int,jbcoin::STInteger<unsigned_int>>
          (STObject *st,TypedField<jbcoin::STInteger<unsigned_int>_> *f)

{
  int iVar1;
  STBase *pSVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  pSVar2 = STObject::peekAtPField(st,&f->super_SField);
  if (pSVar2 != (STBase *)0x0) {
    iVar1 = (*pSVar2->_vptr_STBase[4])(pSVar2);
    if (iVar1 != 0) {
      lVar3 = __dynamic_cast(pSVar2,&STBase::typeinfo,&STInteger<unsigned_int>::typeinfo,0);
      if (lVar3 == 0) {
        Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
      }
      uVar4 = (ulong)*(uint *)(lVar3 + 0x10) << 0x20;
      uVar5 = 1;
      goto LAB_001cb704;
    }
  }
  uVar4 = 0;
  uVar5 = 0;
LAB_001cb704:
  return (optional<unsigned_int>)(uVar4 | uVar5);
}

Assistant:

boost::optional<T>
get (STObject const& st,
    TypedField<U> const& f)
{
    boost::optional<T> t;
    STBase const* const b =
        st.peekAtPField(f);
    if (! b)
        return t;
    auto const id = b->getSType();
    if (id == STI_NOTPRESENT)
        return t;
    auto const u =
        dynamic_cast<U const*>(b);
    // This should never happen
    if (! u)
        Throw<std::runtime_error> (
            "Wrong field type");
    STExchange<U, T>::get(t, *u);
    return t;
}